

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O2

size_t __thiscall wasm::MultiMemoryLowering::getInitialOffset(MultiMemoryLowering *this,Index idx)

{
  Module *this_00;
  Global *pGVar1;
  Const *pCVar2;
  uint64_t uVar3;
  Name name;
  
  if (idx != 0) {
    this_00 = this->wasm;
    name = getOffsetGlobal(this,idx);
    pGVar1 = Module::getGlobal(this_00,name);
    pCVar2 = Expression::cast<wasm::Const>(pGVar1->init);
    uVar3 = Literal::getUnsigned(&pCVar2->value);
    return uVar3;
  }
  return 0;
}

Assistant:

size_t getInitialOffset(Index idx) {
    if (idx == 0) {
      return 0;
    }
    auto* g = wasm->getGlobal(getOffsetGlobal(idx));
    return g->init->cast<Const>()->value.getUnsigned();
  }